

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_sink_set.cc
# Opt level: O3

void absl::lts_20250127::log_internal::FlushLogSinks(void)

{
  undefined8 uVar1;
  undefined8 *puVar2;
  long in_FS_OFFSET;
  
  anon_unknown_0::GlobalSinks();
  if (*(char *)(in_FS_OFFSET + -0x34) == '\x01') {
    Mutex::AssertReaderHeld((Mutex *)&anon_unknown_0::GlobalSinks::global_sinks);
    uVar1 = anon_unknown_0::GlobalSinks::global_sinks.impl_.space_._16_8_;
    for (puVar2 = (undefined8 *)anon_unknown_0::GlobalSinks::global_sinks.impl_.space_._8_8_;
        puVar2 != (undefined8 *)uVar1; puVar2 = puVar2 + 1) {
      (**(code **)(*(long *)*puVar2 + 0x18))();
    }
  }
  else {
    Mutex::ReaderLock((Mutex *)&anon_unknown_0::GlobalSinks::global_sinks);
    *(undefined1 *)(in_FS_OFFSET + -0x34) = 1;
    uVar1 = anon_unknown_0::GlobalSinks::global_sinks.impl_.space_._16_8_;
    for (puVar2 = (undefined8 *)anon_unknown_0::GlobalSinks::global_sinks.impl_.space_._8_8_;
        puVar2 != (undefined8 *)uVar1; puVar2 = puVar2 + 1) {
      (**(code **)(*(long *)*puVar2 + 0x18))();
    }
    *(undefined1 *)(in_FS_OFFSET + -0x34) = 0;
    Mutex::ReaderUnlock((Mutex *)&anon_unknown_0::GlobalSinks::global_sinks);
  }
  return;
}

Assistant:

void FlushLogSinks() { log_internal::GlobalSinks().FlushLogSinks(); }